

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O3

void __thiscall
QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(CurrencyToStringArgument *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->symbol).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->symbol).d.d)->super_QArrayData,2,0x10);
    }
  }
  ::QVariant::~QVariant(&this->value);
  return;
}

Assistant:

CurrencyToStringArgument(const QVariant &v, const QString &s)
            : value(v), symbol(s) { }